

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cni.hpp
# Opt level: O3

any __thiscall cs_impl::cni::operator()(cni *this,vector *args)

{
  var local_48 [5];
  
  (*(code *)((args->super__Vector_base<cs_impl::any,_std::allocator<cs_impl::any>_>)._M_impl.
             super__Vector_impl_data._M_start)->mDat[1].refcount)(local_48);
  cs::try_move(local_48);
  any::recycle(local_48);
  return (any)(proxy *)this;
}

Assistant:

any operator()(cs::vector &args) const
		{
			try {
				return cs::try_move(mCni->call(args));
			}
			catch (const cs::lang_error &e) {
				cs::current_process->cs_eh_callback(e);
			}
			catch (const std::exception &e) {
				cs::current_process->std_eh_callback(e);
			}
			catch (...) {
				cs::current_process->std_eh_callback(cs::fatal_error("CNI:Unrecognized exception."));
			}
			return cs::null_pointer;
		}